

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O0

apx_error_t
apx_clientSocketConnection_create(apx_clientSocketConnection_t *self,msocket_t *socket_object)

{
  undefined1 local_98 [4];
  apx_error_t result;
  apx_connectionInterface_t connection_interface;
  apx_connectionBaseVTable_t base_connection_vtable;
  msocket_t *socket_object_local;
  apx_clientSocketConnection_t *self_local;
  
  if (self == (apx_clientSocketConnection_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
    self->default_buffer_size = 0x1000;
    self->pending_bytes = 0;
    apx_connectionBaseVTable_create
              ((apx_connectionBaseVTable_t *)&connection_interface.remote_file_write_notification,
               apx_clientSocketConnection_vdestroy,apx_clientSocketConnection_vstart,
               apx_clientSocketConnection_vclose);
    create_connection_interface_vtable(self,(apx_connectionInterface_t *)local_98);
    self_local._4_4_ =
         apx_clientConnection_create
                   (&self->base,
                    (apx_connectionBaseVTable_t *)
                    &connection_interface.remote_file_write_notification,
                    (apx_connectionInterface_t *)local_98);
    if (self_local._4_4_ == 0) {
      adt_bytearray_create(&self->send_buffer,0x1000);
      register_msocket_handler(self,socket_object);
      apx_connectionBase_start((apx_connectionBase_t *)self);
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_clientSocketConnection_create(apx_clientSocketConnection_t *self, SOCKET_TYPE * socket_object)
{
   if (self != 0)
   {
      apx_connectionBaseVTable_t base_connection_vtable;
      apx_connectionInterface_t connection_interface;
      MUTEX_INIT(self->lock);
      self->default_buffer_size = SEND_BUFFER_GROW_SIZE;
      self->pending_bytes = 0u;
      apx_connectionBaseVTable_create(&base_connection_vtable,
            apx_clientSocketConnection_vdestroy,
            apx_clientSocketConnection_vstart,
            apx_clientSocketConnection_vclose);
      create_connection_interface_vtable(self, &connection_interface);
      apx_error_t result = apx_clientConnection_create(&self->base, &base_connection_vtable, &connection_interface);
      if (result != APX_NO_ERROR)
      {
         return result;
      }
      adt_bytearray_create(&self->send_buffer, SEND_BUFFER_GROW_SIZE);
      register_msocket_handler(self, socket_object);
      apx_connectionBase_start(&self->base.base);///TODO: Don't call start from the constructor
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}